

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O3

void __thiscall
cppnet::TimerContainer::DoTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TimerSlot *pTVar4;
  element_type *peVar5;
  TimerContainer *this_00;
  _Atomic_word _Var6;
  int iVar7;
  uint32_t uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pwVar9;
  bool bVar10;
  shared_ptr<cppnet::TimerSlot> local_60;
  TimerSlot *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  TimerSlot *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pwVar9 = (run_timer_solts->
           super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pwVar9 != (run_timer_solts->
                super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      p_Var3 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var6 = p_Var3->_M_use_count;
        do {
          if (_Var6 == 0) goto LAB_0011e68f;
          LOCK();
          iVar7 = p_Var3->_M_use_count;
          bVar10 = _Var6 == iVar7;
          if (bVar10) {
            p_Var3->_M_use_count = _Var6 + 1;
            iVar7 = _Var6;
          }
          _Var6 = iVar7;
          UNLOCK();
        } while (!bVar10);
        pTVar4 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (pTVar4 != (TimerSlot *)0x0 && p_Var3->_M_use_count != 0) {
          (**pTVar4->_vptr_TimerSlot)(pTVar4);
          TimerSlot::RmInTimer(pTVar4);
          bVar10 = TimerSlot::IsAlways(pTVar4);
          if (bVar10) {
            TimerSlot::ResetTime(pTVar4);
            this_01 = (this->_root_timer).
                      super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0011e5fb:
              this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0011e5fd:
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
              }
              local_50 = pTVar4;
              local_48 = p_Var3;
              uVar8 = TimerSlot::GetTotalInterval(pTVar4);
              bVar10 = TimerSlot::IsAlways(pTVar4);
              (**(this->super_Timer)._vptr_Timer)(this,&local_50,(ulong)uVar8,(ulong)bVar10);
              if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var1 = &local_48->_M_weak_count;
                  _Var6 = *p_Var1;
                  *p_Var1 = *p_Var1 + -1;
                  UNLOCK();
                }
                else {
                  _Var6 = local_48->_M_weak_count;
                  local_48->_M_weak_count = _Var6 + -1;
                }
                if (_Var6 == 1) {
                  (*local_48->_vptr__Sp_counted_base[3])();
                }
              }
              if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0011e687;
            }
            else {
              iVar7 = this_01->_M_use_count;
              do {
                if (iVar7 == 0) goto LAB_0011e5fb;
                LOCK();
                iVar2 = this_01->_M_use_count;
                bVar10 = iVar7 == iVar2;
                if (bVar10) {
                  this_01->_M_use_count = iVar7 + 1;
                  iVar2 = iVar7;
                }
                iVar7 = iVar2;
                UNLOCK();
              } while (!bVar10);
              peVar5 = (this->_root_timer).
                       super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (peVar5 == (element_type *)0x0 || this_01->_M_use_count == 0) goto LAB_0011e5fd;
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
              }
              local_40 = pTVar4;
              local_38 = p_Var3;
              uVar8 = TimerSlot::GetTotalInterval(pTVar4);
              bVar10 = TimerSlot::IsAlways(pTVar4);
              (**(peVar5->super_Timer)._vptr_Timer)(peVar5,&local_40,(ulong)uVar8,(ulong)bVar10);
              if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var1 = &local_38->_M_weak_count;
                  _Var6 = *p_Var1;
                  *p_Var1 = *p_Var1 + -1;
                  UNLOCK();
                }
                else {
                  _Var6 = local_38->_M_weak_count;
                  local_38->_M_weak_count = _Var6 + -1;
                }
                if (_Var6 == 1) {
                  (*local_38->_vptr__Sp_counted_base[3])();
                }
              }
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
        }
LAB_0011e687:
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
LAB_0011e68f:
      pwVar9 = pwVar9 + 1;
    } while (pwVar9 != (run_timer_solts->
                       super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (((this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr != (element_type *)0x0) &&
     (pwVar9 = (sub_timer_solts->
               super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     pwVar9 != (sub_timer_solts->
               super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      p_Var3 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var6 = p_Var3->_M_use_count;
        do {
          if (_Var6 == 0) goto LAB_0011e7b9;
          LOCK();
          iVar7 = p_Var3->_M_use_count;
          bVar10 = _Var6 == iVar7;
          if (bVar10) {
            p_Var3->_M_use_count = _Var6 + 1;
            iVar7 = _Var6;
          }
          _Var6 = iVar7;
          UNLOCK();
        } while (!bVar10);
        pTVar4 = (pwVar9->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (pTVar4 != (TimerSlot *)0x0 && p_Var3->_M_use_count != 0) {
          this_00 = (this->_sub_timer).
                    super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
          local_60.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pTVar4
          ;
          local_60.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = p_Var3;
          uVar8 = TimerSlot::GetLeftInterval(pTVar4);
          InnerAddTimer(this_00,&local_60,uVar8);
          if (local_60.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
LAB_0011e7b9:
      pwVar9 = pwVar9 + 1;
    } while (pwVar9 != (sub_timer_solts->
                       super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void TimerContainer::DoTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts,
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts) {
    // timer call back
    for (auto iter = run_timer_solts.begin(); iter != run_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        ptr->OnTimer();
        ptr->RmInTimer();

        // add timer again
        if (ptr->IsAlways()) {
            ptr->ResetTime();
            auto root_timer = _root_timer.lock();
            if (root_timer) {
                root_timer->AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
            else {
                AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
        }
    }

    // add sub timer
    if (!_sub_timer) {
        return;
    }
    for (auto iter = sub_timer_solts.begin(); iter != sub_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        _sub_timer->InnerAddTimer(ptr, ptr->GetLeftInterval());
    }
}